

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_normalize(rf_quaternion q)

{
  rf_quaternion rVar1;
  undefined4 local_2c;
  float ilength;
  float length;
  rf_quaternion q_local;
  rf_quaternion result;
  
  ilength = q.x;
  length = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  local_2c = rf_quaternion_len(q);
  if ((local_2c == 0.0) && (!NAN(local_2c))) {
    local_2c = 1.0;
  }
  local_2c = 1.0 / local_2c;
  rVar1.y = length * local_2c;
  rVar1.x = ilength * local_2c;
  rVar1.z = q_local.x * local_2c;
  rVar1.w = q_local.y * local_2c;
  return rVar1;
}

Assistant:

RF_API rf_quaternion rf_quaternion_normalize(rf_quaternion q)
{
    rf_quaternion result = {0};

    float length, ilength;
    length = rf_quaternion_len(q);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f / length;

    result.x = q.x * ilength;
    result.y = q.y * ilength;
    result.z = q.z * ilength;
    result.w = q.w * ilength;

    return result;
}